

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# num_parse_test.cpp
# Opt level: O0

void __thiscall
num_parse_test_serial_parse_floating_Test::TestBody(num_parse_test_serial_parse_floating_Test *this)

{
  bool bVar1;
  reference pvVar2;
  char *pcVar3;
  AssertHelper local_d8;
  Message local_d0;
  double local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  string local_a8;
  _Type local_88;
  AssertHelper local_80;
  Message local_78;
  double local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  double res;
  allocator<char> local_39;
  string local_38;
  array<unsigned_char,_8UL> local_18;
  array<unsigned_char,_8UL> bytes;
  num_parse_test_serial_parse_floating_Test *this_local;
  
  bytes._M_elems = (_Type)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"2.5",&local_39);
  local_18 = mvm::num::serial<double,8ul,mvm::num::big_endian_tag>(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pvVar2 = std::array<unsigned_char,_8UL>::operator[](&local_18,0);
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       mvm::num::parse<double,8ul,mvm::num::big_endian_tag>(pvVar2);
  local_70 = 2.5;
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_68,"res","2.5",(double *)&gtest_ar.message_,&local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kenavolic[P]mvm/tests/num_parse_test.cpp"
               ,0xaa,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"-2.5",(allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  local_88 = (_Type)mvm::num::serial<double,8ul,mvm::num::big_endian_tag>(&local_a8);
  local_18 = (array<unsigned_char,_8UL>)local_88;
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  pvVar2 = std::array<unsigned_char,_8UL>::operator[](&local_18,0);
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       mvm::num::parse<double,8ul,mvm::num::big_endian_tag>(pvVar2);
  local_c8 = -2.5;
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_c0,"res","-2.5",(double *)&gtest_ar.message_,&local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kenavolic[P]mvm/tests/num_parse_test.cpp"
               ,0xaf,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  return;
}

Assistant:

TEST(num_parse_test, serial_parse_floating) {
  auto bytes = serial<double, 8, big_endian_tag>("2.5");
  auto res = parse<double, 8, big_endian_tag>(&bytes[0]);

  EXPECT_EQ(res, 2.5);

  bytes = serial<double, 8, big_endian_tag>("-2.5");
  res = parse<double, 8, big_endian_tag>(&bytes[0]);

  EXPECT_EQ(res, -2.5);
}